

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

interresult __thiscall tetgenmesh::finddirection(tetgenmesh *this,triface *searchtet,point endpt)

{
  tetrahedron pa;
  tetrahedron pc;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  tetrahedron *pppdVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  tetrahedron pc_00;
  tetrahedron ppdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  long lStack_50;
  
  pppdVar4 = searchtet->tet;
  lStack_50 = (long)searchtet->ver;
  pa = pppdVar4[orgpivot[lStack_50]];
  if (pppdVar4[7] == (tetrahedron)this->dummypoint) {
    pppdVar4 = (tetrahedron *)((ulong)pppdVar4[3] & 0xfffffffffffffff0);
    searchtet->tet = pppdVar4;
    if (pppdVar4[4] == pa) {
      lStack_50 = 0xb;
    }
    else if (pppdVar4[5] == pa) {
      lStack_50 = 3;
    }
    else {
      lStack_50 = 7;
      if (pppdVar4[6] != pa) {
        lStack_50 = 0;
      }
    }
    searchtet->ver = (int)lStack_50;
  }
  iVar5 = (int)lStack_50;
  ppdVar10 = pppdVar4[destpivot[iVar5]];
  if (ppdVar10 != (tetrahedron)endpt) {
    pc_00 = pppdVar4[apexpivot[iVar5]];
    if (pc_00 == (tetrahedron)endpt) {
      iVar5 = eprevesymtbl[iVar5];
    }
    else {
      while( true ) {
        pc = pppdVar4[oppopivot[(int)lStack_50]];
        if (pc == (tetrahedron)endpt) break;
        if (pc == (tetrahedron)this->dummypoint) {
          if (this->nonconvex != 0) {
            return ACROSSFACE;
          }
          terminatetetgen(this,2);
        }
        dVar11 = orient3d((double *)pa,(double *)ppdVar10,(double *)pc_00,endpt);
        dVar12 = orient3d((double *)ppdVar10,(double *)pa,(double *)pc,endpt);
        dVar13 = orient3d((double *)pa,(double *)pc_00,(double *)pc,endpt);
        if (dVar11 <= 0.0) {
          if (0.0 < dVar12) {
            if ((dVar13 <= 0.0) ||
               (auVar2._8_8_ = 0, auVar2._0_8_ = this->randomseed * 0x556 + 0x24d69,
               this->randomseed = SUB168(auVar2 % ZEXT816(0xae529),0),
               (auVar2 % ZEXT816(0xae529) & (undefined1  [16])0x1) != (undefined1  [16])0x0))
            goto LAB_0011fa28;
          }
          else if (dVar13 <= 0.0) {
            if ((dVar11 != 0.0) || (NAN(dVar11))) {
              if ((dVar12 == 0.0) && (!NAN(dVar12))) {
                iVar5 = esymtbl[searchtet->ver];
                searchtet->ver = iVar5;
                searchtet->ver = enexttbl[iVar5];
                return ACROSSEDGE - (dVar13 == 0.0);
              }
              if (dVar13 != 0.0) {
                return ACROSSFACE;
              }
              if (NAN(dVar13)) {
                return ACROSSFACE;
              }
              searchtet->ver = eprevesymtbl[searchtet->ver];
            }
            else {
              if ((dVar12 == 0.0) && (!NAN(dVar12))) {
                return ACROSSVERT;
              }
              if ((dVar13 == 0.0) && (!NAN(dVar13))) {
                searchtet->ver = eprevesymtbl[searchtet->ver];
                return ACROSSVERT;
              }
            }
            return ACROSSEDGE;
          }
LAB_0011f9dc:
          iVar5 = eprevtbl[searchtet->ver];
          searchtet->ver = iVar5;
          ppdVar10 = searchtet->tet[facepivot1[iVar5]];
          uVar8 = (uint)ppdVar10 & 0xf;
          searchtet->ver = uVar8;
          pppdVar4 = (tetrahedron *)((ulong)ppdVar10 & 0xfffffffffffffff0);
          searchtet->tet = pppdVar4;
          iVar5 = facepivot2[iVar5][uVar8];
LAB_0011fa90:
          searchtet->ver = iVar5;
          piVar7 = enexttbl + iVar5;
        }
        else {
          if (dVar12 <= 0.0) {
            if ((dVar13 <= 0.0) ||
               (auVar3._8_8_ = 0, auVar3._0_8_ = this->randomseed * 0x556 + 0x24d69,
               this->randomseed = SUB168(auVar3 % ZEXT816(0xae529),0),
               (auVar3 % ZEXT816(0xae529) & (undefined1  [16])0x1) != (undefined1  [16])0x0))
            goto LAB_0011fa61;
            goto LAB_0011f9dc;
          }
          auVar1._8_8_ = 0;
          auVar1._0_8_ = this->randomseed * 0x556 + 0x24d69;
          uVar9 = SUB168(auVar1 % ZEXT816(0xae529),0);
          this->randomseed = uVar9;
          if (dVar13 <= 0.0) {
            if ((auVar1 % ZEXT816(0xae529) & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            goto LAB_0011fa28;
LAB_0011fa61:
            uVar8 = searchtet->ver;
            ppdVar10 = searchtet->tet[uVar8 & 3];
            uVar6 = (uint)ppdVar10 & 0xf;
            searchtet->ver = uVar6;
            pppdVar4 = (tetrahedron *)((ulong)ppdVar10 & 0xfffffffffffffff0);
            searchtet->tet = pppdVar4;
            iVar5 = fsymtbl[(int)uVar8][uVar6];
            goto LAB_0011fa90;
          }
          iVar5 = (int)(uVar9 % 3);
          if (iVar5 == 0) goto LAB_0011fa61;
          if (iVar5 != 1) goto LAB_0011f9dc;
LAB_0011fa28:
          iVar5 = searchtet->ver;
          ppdVar10 = searchtet->tet[facepivot1[iVar5]];
          uVar8 = (uint)ppdVar10 & 0xf;
          searchtet->ver = uVar8;
          pppdVar4 = (tetrahedron *)((ulong)ppdVar10 & 0xfffffffffffffff0);
          searchtet->tet = pppdVar4;
          piVar7 = facepivot2[iVar5] + uVar8;
        }
        lStack_50 = (long)*piVar7;
        searchtet->ver = *piVar7;
        ppdVar10 = pppdVar4[destpivot[lStack_50]];
        pc_00 = pppdVar4[apexpivot[lStack_50]];
      }
      iVar5 = esymtbl[(int)lStack_50];
      searchtet->ver = iVar5;
      iVar5 = enexttbl[iVar5];
    }
    searchtet->ver = iVar5;
  }
  return ACROSSVERT;
}

Assistant:

enum tetgenmesh::interresult 
  tetgenmesh::finddirection(triface* searchtet, point endpt)
{
  triface neightet;
  point pa, pb, pc, pd;
  enum {HMOVE, RMOVE, LMOVE} nextmove;
  REAL hori, rori, lori;
  int t1ver;
  int s;

  // The origin is fixed.
  pa = org(*searchtet);
  if ((point) searchtet->tet[7] == dummypoint) {
    // A hull tet. Choose the neighbor of its base face.
    decode(searchtet->tet[3], *searchtet);
    // Reset the origin to be pa.
    if ((point) searchtet->tet[4] == pa) {
      searchtet->ver = 11;
    } else if ((point) searchtet->tet[5] == pa) {
      searchtet->ver = 3;
    } else if ((point) searchtet->tet[6] == pa) {
      searchtet->ver = 7;
    } else {
      searchtet->ver = 0;
    }
  }

  pb = dest(*searchtet);
  // Check whether the destination or apex is 'endpt'.
  if (pb == endpt) {
    // pa->pb is the search edge.
    return ACROSSVERT;
  }

  pc = apex(*searchtet);
  if (pc == endpt) {
    // pa->pc is the search edge.
    eprevesymself(*searchtet);
    return ACROSSVERT;
  }

  // Walk through tets around pa until the right one is found.
  while (1) {

    pd = oppo(*searchtet);
    // Check whether the opposite vertex is 'endpt'.
    if (pd == endpt) {
      // pa->pd is the search edge.
      esymself(*searchtet);
      enextself(*searchtet);
      return ACROSSVERT;
    }
    // Check if we have entered outside of the domain.
    if (pd == dummypoint) {
      // This is possible when the mesh is non-convex.
      if (nonconvex) {
        return ACROSSFACE; // return ACROSSSUB; // Hit a bounday.
      } else {
        terminatetetgen(this, 2);
      }
    }

    // Now assume that the base face abc coincides with the horizon plane,
    //   and d lies above the horizon.  The search point 'endpt' may lie
    //   above or below the horizon.  We test the orientations of 'endpt'
    //   with respect to three planes: abc (horizon), bad (right plane),
    //   and acd (left plane). 
    hori = orient3d(pa, pb, pc, endpt);
    rori = orient3d(pb, pa, pd, endpt);
    lori = orient3d(pa, pc, pd, endpt);

    // Now decide the tet to move.  It is possible there are more than one
    //   tets are viable moves. Is so, randomly choose one. 
    if (hori > 0) {
      if (rori > 0) {
        if (lori > 0) {
          // Any of the three neighbors is a viable move.
          s = randomnation(3); 
          if (s == 0) {
            nextmove = HMOVE;
          } else if (s == 1) {
            nextmove = RMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // Two tets, below horizon and below right, are viable.
          if (randomnation(2)) {
            nextmove = HMOVE;
          } else {
            nextmove = RMOVE;
          }
        }
      } else {
        if (lori > 0) {
          // Two tets, below horizon and below left, are viable.
          if (randomnation(2)) {
            nextmove = HMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // The tet below horizon is chosen.
          nextmove = HMOVE;
        }
      }
    } else {
      if (rori > 0) {
        if (lori > 0) {
          // Two tets, below right and below left, are viable.
          if (randomnation(2)) {
            nextmove = RMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // The tet below right is chosen.
          nextmove = RMOVE;
        }
      } else {
        if (lori > 0) {
          // The tet below left is chosen.
          nextmove = LMOVE;
        } else {
          // 'endpt' lies either on the plane(s) or across face bcd.
          if (hori == 0) {
            if (rori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pb.
              return ACROSSVERT;
            }
            if (lori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pc.
              eprevesymself(*searchtet); // [a,c,d]
              return ACROSSVERT;
            }
            // pa->'endpt' crosses the edge pb->pc.
            return ACROSSEDGE;
          }
          if (rori == 0) {
            if (lori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pd.
              esymself(*searchtet); // face bad.
              enextself(*searchtet); // face [a,d,b]
              return ACROSSVERT;
            }
            // pa->'endpt' crosses the edge pb->pd.
            esymself(*searchtet); // face bad.
            enextself(*searchtet); // face adb
            return ACROSSEDGE;
          }
          if (lori == 0) {
            // pa->'endpt' crosses the edge pc->pd.
            eprevesymself(*searchtet); // [a,c,d]
            return ACROSSEDGE;
          }
          // pa->'endpt' crosses the face bcd.
          return ACROSSFACE;
        }
      }
    }

    // Move to the next tet, fix pa as its origin.
    if (nextmove == RMOVE) {
      fnextself(*searchtet);
    } else if (nextmove == LMOVE) {
      eprevself(*searchtet);
      fnextself(*searchtet);
      enextself(*searchtet);
    } else { // HMOVE
      fsymself(*searchtet);
      enextself(*searchtet);
    }
    pb = dest(*searchtet);
    pc = apex(*searchtet);

  } // while (1)

}